

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  float fVar1;
  float fVar2;
  float y0;
  float x0;
  undefined2 uVar3;
  undefined2 uVar5;
  undefined4 uVar6;
  ImVec2 IVar4;
  char cVar7;
  ushort uVar8;
  int iVar9;
  ImFontAtlasCustomRect *pIVar10;
  ImFont *pIVar11;
  ImFont **ppIVar12;
  undefined1 auVar13 [16];
  bool bVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  int y;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  uint uVar22;
  long lVar23;
  bool bVar24;
  uint uVar25;
  long lVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  iVar15 = atlas->CustomRectIds[0];
  iVar9 = atlas->TexWidth;
  pIVar10 = (atlas->CustomRects).Data;
  if ((atlas->Flags & 2) == 0) {
    iVar18 = 0;
    lVar21 = 0;
    do {
      lVar23 = 0;
      do {
        cVar7 = "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                [(int)lVar21 + lVar23];
        lVar26 = (long)(int)((uint)pIVar10[iVar15].X + (int)lVar23 +
                            ((uint)pIVar10[iVar15].Y + iVar18) * iVar9);
        atlas->TexPixelsAlpha8[lVar26] = -(cVar7 == '.');
        lVar23 = lVar23 + 1;
        atlas->TexPixelsAlpha8[lVar26 + 0x6d] = -(cVar7 == 'X');
      } while ((int)lVar23 != 0x6c);
      iVar18 = iVar18 + 1;
      lVar21 = (int)lVar21 + lVar23;
    } while (iVar18 != 0x1b);
  }
  else {
    lVar23 = (ulong)pIVar10[iVar15].Y * (long)iVar9 + (ulong)pIVar10[iVar15].X;
    lVar21 = (long)(iVar9 + (int)lVar23);
    atlas->TexPixelsAlpha8[lVar21 + 1] = 0xff;
    atlas->TexPixelsAlpha8[lVar21] = 0xff;
    atlas->TexPixelsAlpha8[lVar23 + 1] = 0xff;
    atlas->TexPixelsAlpha8[lVar23] = 0xff;
  }
  pIVar10 = pIVar10 + iVar15;
  uVar3 = pIVar10->X;
  uVar5 = pIVar10->Y;
  uVar6 = pIVar10->GlyphAdvanceX;
  auVar27._4_4_ = uVar6;
  auVar27._2_2_ = uVar5;
  auVar27._0_2_ = uVar3;
  auVar27._8_8_ = 0;
  auVar27 = vpmovzxwd_avx(auVar27);
  auVar27 = vcvtdq2ps_avx(auVar27);
  auVar13._8_4_ = 0x3f000000;
  auVar13._0_8_ = 0x3f0000003f000000;
  auVar13._12_4_ = 0x3f000000;
  auVar27 = vaddps_avx512vl(auVar27,auVar13);
  auVar28._0_4_ = (atlas->TexUvScale).x * auVar27._0_4_;
  auVar28._4_4_ = (atlas->TexUvScale).y * auVar27._4_4_;
  auVar28._8_4_ = auVar27._8_4_ * 0.0;
  auVar28._12_4_ = auVar27._12_4_ * 0.0;
  IVar4 = (ImVec2)vmovlps_avx(auVar28);
  atlas->TexUvWhitePixel = IVar4;
  iVar15 = (atlas->CustomRects).Size;
  if (0 < iVar15) {
    lVar21 = 0x18;
    lVar23 = 0;
    do {
      pIVar10 = (atlas->CustomRects).Data;
      pIVar11 = *(ImFont **)((long)&pIVar10->ID + lVar21);
      uVar17 = *(uint *)((long)pIVar10 + lVar21 + -0x18);
      if (uVar17 < 0x110000 && pIVar11 != (ImFont *)0x0) {
        fVar1 = (atlas->TexUvScale).x;
        fVar2 = (atlas->TexUvScale).y;
        uVar16 = (uint)*(ushort *)((long)pIVar10 + lVar21 + -0x10);
        uVar22 = (uint)*(ushort *)((long)pIVar10 + lVar21 + -0x14);
        uVar20 = (uint)*(ushort *)((long)pIVar10 + lVar21 + -0xe);
        uVar25 = (uint)*(ushort *)((long)pIVar10 + lVar21 + -0x12);
        y0 = *(float *)((long)pIVar10 + lVar21 + -4);
        x0 = *(float *)((long)pIVar10 + lVar21 + -8);
        ImFont::AddGlyph(pIVar11,(ImWchar)uVar17,x0,y0,x0 + (float)uVar22,y0 + (float)uVar25,
                         fVar1 * (float)uVar16,fVar2 * (float)uVar20,
                         fVar1 * (float)(uVar16 + uVar22),fVar2 * (float)(uVar20 + uVar25),
                         *(float *)((long)pIVar10 + lVar21 + -0xc));
        iVar15 = (atlas->CustomRects).Size;
      }
      lVar23 = lVar23 + 1;
      lVar21 = lVar21 + 0x20;
    } while (lVar23 < iVar15);
  }
  uVar17 = (atlas->Fonts).Size;
  if (0 < (int)uVar17) {
    lVar21 = 0;
    do {
      pIVar11 = (atlas->Fonts).Data[lVar21];
      if (pIVar11->DirtyLookupTables == true) {
        ImFont::BuildLookupTable(pIVar11);
        uVar17 = (atlas->Fonts).Size;
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 < (int)uVar17);
    if (0 < (int)uVar17) {
      ppIVar12 = (atlas->Fonts).Data;
      uVar19 = 0;
      do {
        pIVar11 = ppIVar12[uVar19];
        if (pIVar11->EllipsisChar == 0xffff) {
          lVar21 = 0;
          bVar14 = true;
          do {
            bVar24 = bVar14;
            uVar8 = (&DAT_00434b94)[lVar21];
            if ((((ulong)uVar8 < (ulong)(long)(pIVar11->IndexLookup).Size) &&
                ((pIVar11->IndexLookup).Data[uVar8] != 0xffff)) &&
               ((pIVar11->Glyphs).Data != (ImFontGlyph *)0x0)) {
              pIVar11->EllipsisChar = uVar8;
              break;
            }
            lVar21 = 1;
            bVar14 = false;
          } while (bVar24);
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 != uVar17);
    }
  }
  return;
}

Assistant:

void ImFontAtlasBuildFinish(ImFontAtlas* atlas)
{
    // Render into our custom data block
    ImFontAtlasBuildRenderDefaultTexData(atlas);

    // Register custom rectangle glyphs
    for (int i = 0; i < atlas->CustomRects.Size; i++)
    {
        const ImFontAtlasCustomRect& r = atlas->CustomRects[i];
        if (r.Font == NULL || r.ID >= 0x110000)
            continue;

        IM_ASSERT(r.Font->ContainerAtlas == atlas);
        ImVec2 uv0, uv1;
        atlas->CalcCustomRectUV(&r, &uv0, &uv1);
        r.Font->AddGlyph((ImWchar)r.ID, r.GlyphOffset.x, r.GlyphOffset.y, r.GlyphOffset.x + r.Width, r.GlyphOffset.y + r.Height, uv0.x, uv0.y, uv1.x, uv1.y, r.GlyphAdvanceX);
    }

    // Build all fonts lookup tables
    for (int i = 0; i < atlas->Fonts.Size; i++)
        if (atlas->Fonts[i]->DirtyLookupTables)
            atlas->Fonts[i]->BuildLookupTable();

    // Ellipsis character is required for rendering elided text. We prefer using U+2026 (horizontal ellipsis).
    // However some old fonts may contain ellipsis at U+0085. Here we auto-detect most suitable ellipsis character.
    // FIXME: Also note that 0x2026 is currently seldomly included in our font ranges. Because of this we are more likely to use three individual dots.
    for (int i = 0; i < atlas->Fonts.size(); i++)
    {
        ImFont* font = atlas->Fonts[i];
        if (font->EllipsisChar != (ImWchar)-1)
            continue;
        const ImWchar ellipsis_variants[] = { (ImWchar)0x2026, (ImWchar)0x0085 };
        for (int j = 0; j < IM_ARRAYSIZE(ellipsis_variants); j++)
            if (font->FindGlyphNoFallback(ellipsis_variants[j]) != NULL) // Verify glyph exists
            {
                font->EllipsisChar = ellipsis_variants[j];
                break;
            }
    }
}